

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDepthRangeTests.cpp
# Opt level: O2

float deqp::gles2::Functional::triQuadInterpolate(float x,float y,Vec4 *quad)

{
  float fVar1;
  
  if (x + y < 1.0) {
    fVar1 = quad->m_data[0];
    return (quad->m_data[1] - fVar1) * y + (quad->m_data[2] - fVar1) * x + fVar1;
  }
  fVar1 = quad->m_data[3];
  return (quad->m_data[2] - fVar1) * (1.0 - y) + (quad->m_data[1] - fVar1) * (1.0 - x) + fVar1;
}

Assistant:

inline float triQuadInterpolate (const float x, const float y, const tcu::Vec4& quad)
{
	// \note Top left fill rule.
	if (x + y < 1.0f)
		return triangleInterpolate(quad.x(), quad.y(), quad.z(), x, y);
	else
		return triangleInterpolate(quad.w(), quad.z(), quad.y(), 1.0f-x, 1.0f-y);
}